

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O2

_tPseudoDtSels * __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels<yactfr::internal::PseudoVarType>
          (_tPseudoDtSels *__return_storage_ptr__,DtFromPseudoRootDtConverter *this,
          PseudoVarType *pseudoDt)

{
  reference_const_type pDVar1;
  ConstPseudoDtSet pseudoSelDts;
  _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  if ((pseudoDt->_selLoc).super_type.m_initialized == false) {
    __assert_fail("pseudoDt.selLoc()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x33d,
                  "DtFromPseudoRootDtConverter::_tPseudoDtSels yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT &) const [PseudoDtT = yactfr::internal::PseudoVarType]"
                 );
  }
  pDVar1 = boost::optional<yactfr::DataLocation>::get(&pseudoDt->_selLoc);
  _findPseudoDts((ConstPseudoDtSet *)&local_60,this,pDVar1,&pseudoDt->super_PseudoDt);
  if (local_60._M_element_count != 0) {
    pDVar1 = boost::optional<yactfr::DataLocation>::get(&pseudoDt->_selLoc);
    std::
    pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
    ::
    pair<std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>,_true>
              (__return_storage_ptr__,pDVar1,
               (unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                *)&local_60);
    std::
    _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_60);
    return __return_storage_ptr__;
  }
  __assert_fail("!pseudoSelDts.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                ,0x341,
                "DtFromPseudoRootDtConverter::_tPseudoDtSels yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT &) const [PseudoDtT = yactfr::internal::PseudoVarType]"
               );
}

Assistant:

DtFromPseudoRootDtConverter::_tPseudoDtSels DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT& pseudoDt) const
{
    assert(pseudoDt.selLoc());

    auto pseudoSelDts = this->_findPseudoDts(*pseudoDt.selLoc(), pseudoDt);

    assert(!pseudoSelDts.empty());
    return {*pseudoDt.selLoc(), std::move(pseudoSelDts)};
}